

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_write.c
# Opt level: O1

int TIFFAppendToStrip(TIFF *tif,uint32_t strip,uint8_t *data,tmsize_t cc)

{
  byte *pbVar1;
  uint uVar2;
  uint64_t *puVar3;
  bool bVar4;
  int iVar5;
  toff_t off;
  void *p;
  ulong uVar6;
  tmsize_t tVar7;
  uint64_t uVar8;
  char *pcVar9;
  toff_t tVar10;
  long lVar11;
  ulong s;
  uint64_t uVar12;
  ulong uVar13;
  
  if (tif->tif_curoff == 0) {
    tif->tif_lastvalidoff = 0;
  }
  tVar10 = (tif->tif_dir).td_stripoffset_p[strip];
  uVar8 = 0xffffffffffffffff;
  if (tif->tif_curoff == 0 || tVar10 == 0) {
    if ((tif->tif_dir).td_nstrips == 0) {
      __assert_fail("td->td_nstrips > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_write.c"
                    ,0x304,"int TIFFAppendToStrip(TIFF *, uint32_t, uint8_t *, tmsize_t)");
    }
    if (((tVar10 == 0) || (uVar6 = (tif->tif_dir).td_stripbytecount_p[strip], uVar6 < (ulong)cc)) ||
       (uVar6 == 0)) {
      tVar10 = (*tif->tif_seekproc)(tif->tif_clientdata,0,2);
      (tif->tif_dir).td_stripoffset_p[strip] = tVar10;
      pbVar1 = (byte *)((long)&tif->tif_flags + 2);
      *pbVar1 = *pbVar1 | 0x20;
    }
    else {
      iVar5 = _TIFFSeekOK(tif,tVar10);
      if (iVar5 == 0) {
        uVar2 = tif->tif_row;
        pcVar9 = "Seek error at scanline %lu";
        goto LAB_002b90d0;
      }
      tif->tif_lastvalidoff =
           (tif->tif_dir).td_stripbytecount_p[strip] + (tif->tif_dir).td_stripoffset_p[strip];
    }
    puVar3 = (tif->tif_dir).td_stripbytecount_p;
    tif->tif_curoff = (tif->tif_dir).td_stripoffset_p[strip];
    uVar8 = puVar3[strip];
    puVar3[strip] = 0;
  }
  uVar6 = tif->tif_curoff + cc;
  uVar13 = uVar6 & 0xffffffff;
  if ((tif->tif_flags & 0x80000) != 0) {
    uVar13 = uVar6;
  }
  if (uVar13 < tif->tif_curoff || uVar13 < (ulong)cc) {
    TIFFErrorExtR(tif,"TIFFAppendToStrip","Maximum TIFF file size exceeded");
    return 0;
  }
  if (((tif->tif_lastvalidoff != 0) && (tif->tif_lastvalidoff < uVar13)) &&
     (uVar6 = (tif->tif_dir).td_stripbytecount_p[strip], uVar6 != 0)) {
    s = 0x100000;
    if (uVar6 < 0x100000) {
      s = uVar6;
    }
    tVar10 = (tif->tif_dir).td_stripoffset_p[strip];
    off = (*tif->tif_seekproc)(tif->tif_clientdata,0,2);
    uVar13 = cc + uVar6 + off;
    if (((tif->tif_flags & 0x80000) == 0) && (uVar13 >> 0x20 != 0)) {
      pcVar9 = "Maximum TIFF file size exceeded";
LAB_002b9013:
      TIFFErrorExtR(tif,"TIFFAppendToStrip",pcVar9);
LAB_002b906a:
      bVar4 = false;
    }
    else {
      p = _TIFFmallocExt(tif,s);
      if (p == (void *)0x0) {
        pcVar9 = "No space for output buffer";
        goto LAB_002b9013;
      }
      pbVar1 = (byte *)((long)&tif->tif_flags + 2);
      *pbVar1 = *pbVar1 | 0x20;
      (tif->tif_dir).td_stripoffset_p[strip] = off;
      (tif->tif_dir).td_stripbytecount_p[strip] = 0;
      lVar11 = -uVar6;
      do {
        iVar5 = _TIFFSeekOK(tif,tVar10);
        if (iVar5 == 0) {
LAB_002b9022:
          pcVar9 = "Seek error";
LAB_002b9050:
          TIFFErrorExtR(tif,"TIFFAppendToStrip",pcVar9);
          _TIFFfreeExt(tif,p);
          goto LAB_002b906a;
        }
        uVar6 = (*tif->tif_readproc)(tif->tif_clientdata,p,s);
        if (uVar6 != s) {
          pcVar9 = "Cannot read";
          goto LAB_002b9050;
        }
        iVar5 = _TIFFSeekOK(tif,off);
        if (iVar5 == 0) goto LAB_002b9022;
        uVar6 = (*tif->tif_writeproc)(tif->tif_clientdata,p,s);
        if (uVar6 != s) {
          pcVar9 = "Cannot write";
          goto LAB_002b9050;
        }
        tVar10 = tVar10 + s;
        off = off + s;
        puVar3 = (tif->tif_dir).td_stripbytecount_p + strip;
        *puVar3 = *puVar3 + s;
        lVar11 = lVar11 + s;
      } while (lVar11 != 0);
      _TIFFfreeExt(tif,p);
      uVar13 = off + cc;
      bVar4 = true;
    }
    if (!bVar4) {
      return 0;
    }
  }
  tVar7 = (*tif->tif_writeproc)(tif->tif_clientdata,data,cc);
  if (tVar7 == cc) {
    tif->tif_curoff = uVar13;
    puVar3 = (tif->tif_dir).td_stripbytecount_p;
    uVar12 = cc + puVar3[strip];
    puVar3[strip] = uVar12;
    if (uVar12 == uVar8) {
      return 1;
    }
    pbVar1 = (byte *)((long)&tif->tif_flags + 2);
    *pbVar1 = *pbVar1 | 0x20;
    return 1;
  }
  uVar2 = tif->tif_row;
  pcVar9 = "Write error at scanline %lu";
LAB_002b90d0:
  TIFFErrorExtR(tif,"TIFFAppendToStrip",pcVar9,(ulong)uVar2);
  return 0;
}

Assistant:

static int TIFFAppendToStrip(TIFF *tif, uint32_t strip, uint8_t *data,
                             tmsize_t cc)
{
    static const char module[] = "TIFFAppendToStrip";
    TIFFDirectory *td = &tif->tif_dir;
    uint64_t m;
    int64_t old_byte_count = -1;

    if (tif->tif_curoff == 0)
        tif->tif_lastvalidoff = 0;

    if (td->td_stripoffset_p[strip] == 0 || tif->tif_curoff == 0)
    {
        assert(td->td_nstrips > 0);

        if (td->td_stripbytecount_p[strip] != 0 &&
            td->td_stripoffset_p[strip] != 0 &&
            td->td_stripbytecount_p[strip] >= (uint64_t)cc)
        {
            /*
             * There is already tile data on disk, and the new tile
             * data we have will fit in the same space.  The only
             * aspect of this that is risky is that there could be
             * more data to append to this strip before we are done
             * depending on how we are getting called.
             */
            if (!SeekOK(tif, td->td_stripoffset_p[strip]))
            {
                TIFFErrorExtR(tif, module, "Seek error at scanline %lu",
                              (unsigned long)tif->tif_row);
                return (0);
            }

            tif->tif_lastvalidoff =
                td->td_stripoffset_p[strip] + td->td_stripbytecount_p[strip];
        }
        else
        {
            /*
             * Seek to end of file, and set that as our location to
             * write this strip.
             */
            td->td_stripoffset_p[strip] = TIFFSeekFile(tif, 0, SEEK_END);
            tif->tif_flags |= TIFF_DIRTYSTRIP;
        }

        tif->tif_curoff = td->td_stripoffset_p[strip];

        /*
         * We are starting a fresh strip/tile, so set the size to zero.
         */
        old_byte_count = td->td_stripbytecount_p[strip];
        td->td_stripbytecount_p[strip] = 0;
    }

    m = tif->tif_curoff + cc;
    if (!(tif->tif_flags & TIFF_BIGTIFF))
        m = (uint32_t)m;
    if ((m < tif->tif_curoff) || (m < (uint64_t)cc))
    {
        TIFFErrorExtR(tif, module, "Maximum TIFF file size exceeded");
        return (0);
    }

    if (tif->tif_lastvalidoff != 0 && m > tif->tif_lastvalidoff &&
        td->td_stripbytecount_p[strip] > 0)
    {
        /* Ouch: we have detected that we are rewriting in place a strip/tile */
        /* with several calls to TIFFAppendToStrip(). The first call was with */
        /* a size smaller than the previous size of the strip/tile, so we */
        /* opted to rewrite in place, but a following call causes us to go */
        /* outsize of the strip/tile area, so we have to finally go for a */
        /* append-at-end-of-file strategy, and start by moving what we already
         */
        /* wrote. */
        tmsize_t tempSize;
        void *temp;
        uint64_t offsetRead;
        uint64_t offsetWrite;
        uint64_t toCopy = td->td_stripbytecount_p[strip];

        if (toCopy < 1024 * 1024)
            tempSize = (tmsize_t)toCopy;
        else
            tempSize = 1024 * 1024;

        offsetRead = td->td_stripoffset_p[strip];
        offsetWrite = TIFFSeekFile(tif, 0, SEEK_END);

        m = offsetWrite + toCopy + cc;
        if (!(tif->tif_flags & TIFF_BIGTIFF) && m != (uint32_t)m)
        {
            TIFFErrorExtR(tif, module, "Maximum TIFF file size exceeded");
            return (0);
        }

        temp = _TIFFmallocExt(tif, tempSize);
        if (temp == NULL)
        {
            TIFFErrorExtR(tif, module, "No space for output buffer");
            return (0);
        }

        tif->tif_flags |= TIFF_DIRTYSTRIP;

        td->td_stripoffset_p[strip] = offsetWrite;
        td->td_stripbytecount_p[strip] = 0;

        /* Move data written by previous calls to us at end of file */
        while (toCopy > 0)
        {
            if (!SeekOK(tif, offsetRead))
            {
                TIFFErrorExtR(tif, module, "Seek error");
                _TIFFfreeExt(tif, temp);
                return (0);
            }
            if (!ReadOK(tif, temp, tempSize))
            {
                TIFFErrorExtR(tif, module, "Cannot read");
                _TIFFfreeExt(tif, temp);
                return (0);
            }
            if (!SeekOK(tif, offsetWrite))
            {
                TIFFErrorExtR(tif, module, "Seek error");
                _TIFFfreeExt(tif, temp);
                return (0);
            }
            if (!WriteOK(tif, temp, tempSize))
            {
                TIFFErrorExtR(tif, module, "Cannot write");
                _TIFFfreeExt(tif, temp);
                return (0);
            }
            offsetRead += tempSize;
            offsetWrite += tempSize;
            td->td_stripbytecount_p[strip] += tempSize;
            toCopy -= tempSize;
        }
        _TIFFfreeExt(tif, temp);

        /* Append the data of this call */
        offsetWrite += cc;
        m = offsetWrite;
    }

    if (!WriteOK(tif, data, cc))
    {
        TIFFErrorExtR(tif, module, "Write error at scanline %lu",
                      (unsigned long)tif->tif_row);
        return (0);
    }
    tif->tif_curoff = m;
    td->td_stripbytecount_p[strip] += cc;

    if ((int64_t)td->td_stripbytecount_p[strip] != old_byte_count)
        tif->tif_flags |= TIFF_DIRTYSTRIP;

    return (1);
}